

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record_Query_R_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Record_Query_R_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Record_Query_R_PDU *this)

{
  pointer puVar1;
  ostream *poVar2;
  KINT32 Value;
  pointer puVar3;
  KStringStream ss;
  KString local_238;
  KString local_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_1d8,(Header7 *)this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-Record Query-R PDU-\n",0x15);
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_1f8,&this->super_Simulation_Management_Header);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tRequest ID:                ",0x1c);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  Reliability_Header::GetAsString_abi_cxx11_(&local_218,&this->super_Reliability_Header);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tEvent Type:                ",0x1c);
  DATA_TYPE::ENUMS::GetEnumAsStringEventType_abi_cxx11_
            (&local_238,(ENUMS *)(ulong)this->m_ui16EvntTyp,Value);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_238._M_dataplus._M_p,local_238._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tTime:                      ",0x1c);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tNumber Of Record IDs:      ",0x1c);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  puVar1 = (this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\t",1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

KString Record_Query_R_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Record Query-R PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "\tRequest ID:                "   << m_ui32RqId
       << Reliability_Header::GetAsString()
       << "\tEvent Type:                "   << GetEnumAsStringEventType( m_ui16EvntTyp ) << "\n"
       << "\tTime:                      "   << m_ui32Time     << "\n"
       << "\tNumber Of Record IDs:      "   << m_ui32NumRecs  << "\n";

    vector<KUINT32>::const_iterator citr = m_vui32RecID.begin();
    vector<KUINT32>::const_iterator citrEnd = m_vui32RecID.end();

    for( ; citr != citrEnd; ++citr )
    {
        ss << "\t" << *citr << "\n";
    }

    return ss.str();
}